

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

Dim __thiscall spv::Builder::getTypeDimensionality(Builder *this,Id typeId)

{
  Instruction *this_00;
  Dim DVar1;
  
  this_00 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start[typeId];
  if (this_00->opCode == OpTypeImage) {
    DVar1 = Instruction::getImmediateOperand(this_00,1);
    return DVar1;
  }
  __assert_fail("isImageType(typeId)",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.h"
                ,0x16c,"Dim spv::Builder::getTypeDimensionality(Id) const");
}

Assistant:

Instruction* getInstruction(Id id) const { return idToInstruction[id]; }